

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Value::Which,capnp::schema::Value::Which&>&,char_const(&)[26],unsigned_int,unsigned_int>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which_&> *params,
          char (*params_1) [26],uint *params_2,uint *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  char (*params_00) [26];
  uint *params_01;
  uint *params_02;
  long lVar4;
  String argValues [4];
  long *plVar5;
  undefined8 uVar6;
  long local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  long local_98 [3];
  String local_80;
  String local_68;
  String local_50;
  
  this->exception = (Exception *)0x0;
  _::operator*(&local_b8,params,CONCAT44(in_register_00000014,line),
               CONCAT44(in_register_0000000c,code));
  local_98[0] = local_b8;
  local_98[1] = local_b0;
  local_98[2] = uStack_a8;
  str<char_const(&)[26]>(&local_80,(kj *)params_1,params_00);
  str<unsigned_int&>(&local_68,(kj *)params_2,params_01);
  str<unsigned_int&>(&local_50,(kj *)params_3,params_02);
  plVar5 = local_98;
  uVar6 = 4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)local_98 + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)local_98 + lVar4 + 8);
      *(undefined8 *)((long)local_98 + lVar4) = 0;
      *(undefined8 *)((long)local_98 + lVar4 + 8) = 0;
      puVar3 = *(undefined8 **)((long)local_98 + lVar4 + 0x10);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,plVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}